

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  uint8_t *__ptr;
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t delta;
  bool bVar4;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t local_288;
  size_t local_268;
  uint8_t *local_260;
  uint8_t *local_258;
  size_t local_250;
  uint8_t *local_248;
  size_t sStack_240;
  uint8_t local_238 [520];
  
  local_250 = secret.len;
  local_258 = secret.base;
  local_288.base = local_238;
  local_288.off = 0;
  local_288.capacity = 0x200;
  local_288._24_8_ = local_288._24_8_ & 0xffffffff00000000;
  iVar2 = ptls_buffer_reserve(&local_288,2);
  if (iVar2 == 0) {
    *(ushort *)(local_288.base + local_288.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_288.off = local_288.off + 2;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = ptls_buffer_reserve(&local_288,1);
    if (iVar2 == 0) {
      local_288.base[local_288.off] = '\0';
      local_288.off = local_288.off + 1;
      iVar2 = 0;
    }
    iVar3 = 6;
    if (iVar2 == 0) {
      local_268 = local_288.off;
      iVar2 = ptls_buffer_reserve(&local_288,9);
      if (iVar2 == 0) {
        builtin_memcpy(local_288.base + local_288.off,"TLS 1.3, ",9);
        local_288.off = local_288.off + 9;
        iVar2 = 0;
      }
      if (iVar2 == 0) {
        delta = strlen(label);
        iVar2 = 0;
        if ((delta != 0) &&
           (iVar2 = ptls_buffer_reserve(&local_288,delta), sVar1 = local_288.off, iVar2 == 0)) {
          memcpy(local_288.base + local_288.off,label,delta);
          local_288.off = delta + sVar1;
          iVar2 = 0;
        }
        bVar4 = iVar2 == 0;
        iVar3 = 6;
        if (bVar4) {
          iVar3 = 0;
        }
      }
      else {
        iVar3 = 6;
        bVar4 = false;
      }
      if (bVar4) {
        local_288.base[local_268 - 1] = (char)local_288.off - (char)local_268;
        iVar3 = 0;
      }
    }
    if (iVar3 != 6) {
      if (iVar3 != 0) {
        return iVar2;
      }
      iVar2 = ptls_buffer_reserve(&local_288,1);
      if (iVar2 == 0) {
        local_288.base[local_288.off] = '\0';
        local_288.off = local_288.off + 1;
        iVar2 = 0;
      }
      iVar3 = 6;
      if (iVar2 == 0) {
        local_268 = local_288.off;
        iVar2 = 0;
        if (hash_value.len != 0) {
          local_260 = hash_value.base;
          iVar2 = ptls_buffer_reserve(&local_288,hash_value.len);
          sVar1 = local_288.off;
          if (iVar2 == 0) {
            memcpy(local_288.base + local_288.off,local_260,hash_value.len);
            local_288.off = sVar1 + hash_value.len;
            iVar2 = 0;
          }
        }
        if (iVar2 == 0) {
          local_288.base[local_268 - 1] = (char)local_288.off - (char)local_268;
          iVar3 = 0;
        }
      }
      if (iVar3 != 6) {
        if (iVar3 != 0) {
          return iVar2;
        }
        local_248 = local_288.base;
        sStack_240 = local_288.off;
        prk.len = local_250;
        prk.base = local_258;
        info.len = local_288.off;
        info.base = local_288.base;
        iVar2 = ptls_hkdf_expand(algo,output,outlen,prk,info);
      }
    }
  }
  __ptr = local_288.base;
  (*ptls_clear_memory)(local_288.base,local_288.off);
  if (local_288.is_allocated != 0) {
    free(__ptr);
  }
  return iVar2;
}

Assistant:

static int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                             ptls_iovec_t hash_value)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        const char *prefix = "TLS 1.3, ";
        ptls_buffer_pushv(&hkdf_label, prefix, strlen(prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}